

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemViewPrivate::disconnectAll(QAbstractItemViewPrivate *this)

{
  QPointer<QItemSelectionModel> *this_00;
  byte bVar1;
  offset_in_QAbstractItemView_to_subr slot;
  Data *pDVar2;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar3;
  Span *pSVar4;
  Entry *pEVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  QObject *pQVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  Object *sender;
  _Rb_tree_node_base *p_Var11;
  QObject *sender_00;
  QPointer *this_01;
  long lVar12;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  slot = *(offset_in_QAbstractItemView_to_subr *)
          &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
           field_0x8;
  for (lVar12 = 0x4a0; lVar12 != 0x510; lVar12 = lVar12 + 8) {
    QObject::disconnect((Connection *)
                        (&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.super_QObjectPrivate + lVar12));
  }
  for (lVar12 = 0x510; lVar12 != 0x530; lVar12 = lVar12 + 8) {
    QObject::disconnect((Connection *)
                        (&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.super_QObjectPrivate + lVar12));
  }
  pDVar2 = (this->itemDelegate).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar8 = (QObject *)0x0;
  }
  else {
    pQVar8 = (this->itemDelegate).wp.value;
  }
  disconnectDelegate(this,(QAbstractItemDelegate *)pQVar8);
  pQVar3 = (this->rowDelegates).d.d.ptr;
  if (pQVar3 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var7 = (_Base_ptr)0x0;
  }
  else {
    p_Var7 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var11 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar3 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var11 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var7 != p_Var11; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    if ((p_Var7[1]._M_parent == (_Base_ptr)0x0) || (*(int *)&(p_Var7[1]._M_parent)->field_0x4 == 0))
    {
      p_Var10 = (_Base_ptr)0x0;
    }
    else {
      p_Var10 = p_Var7[1]._M_left;
    }
    disconnectDelegate(this,(QAbstractItemDelegate *)p_Var10);
  }
  pQVar3 = (this->columnDelegates).d.d.ptr;
  if (pQVar3 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var7 = (_Base_ptr)0x0;
  }
  else {
    p_Var7 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var11 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar3 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var11 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var7 != p_Var11; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    if ((p_Var7[1]._M_parent == (_Base_ptr)0x0) || (*(int *)&(p_Var7[1]._M_parent)->field_0x4 == 0))
    {
      p_Var10 = (_Base_ptr)0x0;
    }
    else {
      p_Var10 = p_Var7[1]._M_left;
    }
    disconnectDelegate(this,(QAbstractItemDelegate *)p_Var10);
  }
  if (this->model != (QAbstractItemModel *)0x0) {
    bVar6 = QPointer::operator_cast_to_bool((QPointer *)&this->selectionModel);
    if (bVar6) {
      pDVar2 = (this->selectionModel).wp.d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar8 = (QObject *)0x0;
      }
      else {
        pQVar8 = (this->selectionModel).wp.value;
      }
      QObject::disconnect<void(QObject::*)(QObject*),void(QObject::*)()>
                ((Object *)this->model,(offset_in_QObject_to_subr)QObject::destroyed,(Object *)0x0,
                 (offset_in_QObject_to_subr)pQVar8);
    }
  }
  this_00 = &this->selectionModel;
  bVar6 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar6) {
    pDVar2 = (this_00->wp).d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar8 = (QObject *)0x0;
    }
    else {
      pQVar8 = (this->selectionModel).wp.value;
    }
    sender_00 = (QObject *)0x0;
    QObject::
    disconnect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QAbstractItemView::*)(QItemSelection_const&,QItemSelection_const&)>
              ((Object *)pQVar8,
               (offset_in_QItemSelectionModel_to_subr)QItemSelectionModel::selectionChanged,
               (Object *)0x0,slot);
    pDVar2 = (this_00->wp).d;
    if (pDVar2 != (Data *)0x0) {
      if (*(int *)(pDVar2 + 4) == 0) {
        sender_00 = (QObject *)0x0;
      }
      else {
        sender_00 = (this->selectionModel).wp.value;
      }
    }
    QObject::
    disconnect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&,QModelIndex_const&)>
              ((Object *)sender_00,
               (offset_in_QItemSelectionModel_to_subr)QItemSelectionModel::currentChanged,
               (Object *)0x0,slot);
  }
  local_48 = (piter)QHash<QPersistentModelIndex,_QEditorInfo>::begin(&this->indexEditorHash);
  while( true ) {
    if (local_48.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0 &&
        local_48.bucket == 0) break;
    pSVar4 = (local_48.d)->spans;
    uVar9 = local_48.bucket >> 7;
    pEVar5 = pSVar4[uVar9].entries;
    bVar1 = pSVar4[uVar9].offsets[(uint)local_48.bucket & 0x7f];
    if (pEVar5[bVar1].storage.data[0x18] == '\0') {
      this_01 = (QPointer *)(pEVar5[bVar1].storage.data + 8);
      bVar6 = QPointer::operator_cast_to_bool(this_01);
      if (bVar6) {
        lVar12 = *(long *)this_01;
        if ((lVar12 == 0) || (*(int *)(lVar12 + 4) == 0)) {
          sender = (Object *)0x0;
        }
        else {
          sender = *(Object **)(pEVar5[bVar1].storage.data + 0x10);
        }
        QObject::disconnect<void(QObject::*)(QObject*),void(QAbstractItemView::*)(QObject*)>
                  (sender,(offset_in_QObject_to_subr)QObject::destroyed,(Object *)0x0,slot);
      }
    }
    QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::operator++
              (&local_48);
  }
  QObject::disconnect(&this->scollerConnection);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::disconnectAll()
{
    Q_Q(QAbstractItemView);
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : scrollbarConnections)
      QObject::disconnect(connection);
    disconnectDelegate(itemDelegate);
    for (QAbstractItemDelegate *delegate : std::as_const(rowDelegates))
        disconnectDelegate(delegate);
    for (QAbstractItemDelegate *delegate : std::as_const(columnDelegates))
        disconnectDelegate(delegate);
    if (model && selectionModel) {
        QObject::disconnect(model, &QAbstractItemModel::destroyed,
                            selectionModel, &QItemSelectionModel::deleteLater);
    }
    if (selectionModel) {
        QObject::disconnect(selectionModel, &QItemSelectionModel::selectionChanged,
                            q, &QAbstractItemView::selectionChanged);
        QObject::disconnect(selectionModel, &QItemSelectionModel::currentChanged,
                            q, &QAbstractItemView::currentChanged);
    }
    for (const auto &info : std::as_const(indexEditorHash)) {
        if (!info.isStatic && info.widget)
            QObject::disconnect(info.widget, &QWidget::destroyed, q, &QAbstractItemView::editorDestroyed);
    }
#if QT_CONFIG(gestures) && QT_CONFIG(scroller)
    QObject::disconnect(scollerConnection);
#endif
}